

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeltype.h
# Opt level: O0

int MElementType_NNodes(MElementType elType)

{
  undefined4 in_EDI;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  int local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = 1;
    break;
  case 1:
    local_4 = 2;
    break;
  case 2:
    local_4 = 3;
    break;
  case 3:
    local_4 = 4;
    break;
  case 4:
    local_4 = 4;
    break;
  case 5:
    local_4 = 5;
    break;
  case 6:
    local_4 = 6;
    break;
  case 7:
    local_4 = 8;
    break;
  default:
    std::operator<<((ostream *)&std::cout,"ElementType not found!");
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

inline int MElementType_NNodes(MElementType elType)
{
	switch(elType)
	{
        case(0)://point
        {
            return 1;
        }
		case(1)://line
		{
			return 2;
		}
		case(2)://triangle
		{
			return 3;
		}
		case(3)://quadrilateral
		{
			return 4;
		}
		case(4)://tetraedron
		{
			return 4;
		}
		case(5)://pyramid
		{
			return 5;
		}
		case(6)://prism
		{
			return 6;
		}
		case(7)://cube
		{
			return 8;
		}
		default:
		{
			std::cout << "ElementType not found!";
			DebugStop();
		}
	}
	DebugStop();
	return -1;
}